

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O0

int test_mp_check_ext_data(void)

{
  int iVar1;
  char *local_d0;
  char *p_23;
  char *p_22;
  char *p_21;
  char *p_20;
  char *p_19;
  char *p_18;
  char *p_17;
  char *p_16;
  char *p_15;
  char *p_14;
  char *p_13;
  char *p_12;
  char *p_11;
  char *p_10;
  char *p_9;
  char *p_8;
  char *p_7;
  char *p_6;
  char *p_5;
  char *p_4;
  char *p_3;
  char *p_2;
  char *p_1;
  char *p;
  mp_check_ext_data_f mp_check_ext_data_svp;
  
  _plan(0x18,true);
  _space(_stdout);
  printf("# *** %s ***\n","test_mp_check_ext_data");
  p = (char *)mp_check_ext_data;
  mp_check_ext_data = mp_check_ext_data_test;
  p_1 = anon_var_dwarf_dbc;
  iVar1 = mp_check(&p_1,anon_var_dwarf_dbc + 3);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xc7\\x00\\x13\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x630,
      "invalid ext8 - bad type");
  p_2 = anon_var_dwarf_de0;
  iVar1 = mp_check(&p_2,anon_var_dwarf_de0 + 4);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xc7\\x01\\x42\\x13\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x631,
      "invalid ext8 - bad data");
  p_3 = anon_var_dwarf_e04;
  iVar1 = mp_check(&p_3,anon_var_dwarf_e04 + 4);
  _ok((uint)(iVar1 == 0),"mp_check(&p, p + sizeof(\"\\xc7\\x01\\x42\\x01\") - 1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x632,
      "valid ext8");
  p_4 = anon_var_dwarf_e28;
  iVar1 = mp_check(&p_4,anon_var_dwarf_e28 + 4);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xc8\\x00\\x00\\x13\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x635,
      "invalid ext16 - bad type");
  p_5 = anon_var_dwarf_e58;
  iVar1 = mp_check(&p_5,anon_var_dwarf_e58 + 5);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xc8\\x00\\x01\\x42\\x13\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x636,
      "invalid ext16 - bad data");
  p_6 = anon_var_dwarf_e7c;
  iVar1 = mp_check(&p_6,anon_var_dwarf_e7c + 5);
  _ok((uint)(iVar1 == 0),"mp_check(&p, p + sizeof(\"\\xc8\\x00\\x01\\x42\\x01\") - 1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x637,
      "valid ext16");
  p_7 = anon_var_dwarf_eac;
  iVar1 = mp_check(&p_7,anon_var_dwarf_eac + 6);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xc9\\x00\\x00\\x00\\x00\\x13\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x63a,
      "invalid ext32 - bad type");
  p_8 = anon_var_dwarf_ed0;
  iVar1 = mp_check(&p_8,anon_var_dwarf_ed0 + 7);
  _ok((uint)(iVar1 != 0),
      "mp_check(&p, p + sizeof(\"\\xc9\\x00\\x00\\x00\\x01\\x42\\x13\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x63b,
      "invalid ext32 - bad data");
  p_9 = anon_var_dwarf_ef4;
  iVar1 = mp_check(&p_9,anon_var_dwarf_ef4 + 7);
  _ok((uint)(iVar1 == 0),
      "mp_check(&p, p + sizeof(\"\\xc9\\x00\\x00\\x00\\x01\\x42\\x01\") - 1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x63c,
      "valid ext32");
  p_10 = anon_var_dwarf_f18;
  iVar1 = mp_check(&p_10,anon_var_dwarf_f18 + 3);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xd4\\x13\\x01\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x63f,
      "invalid fixext8 - bad type");
  p_11 = anon_var_dwarf_f48;
  iVar1 = mp_check(&p_11,anon_var_dwarf_f48 + 3);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xd4\\x42\\x13\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x640,
      "invalid fixext8 - bad data");
  p_12 = anon_var_dwarf_f6c;
  iVar1 = mp_check(&p_12,anon_var_dwarf_f6c + 3);
  _ok((uint)(iVar1 == 0),"mp_check(&p, p + sizeof(\"\\xd4\\x42\\x01\") - 1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x641,
      "valid fixext8");
  p_13 = anon_var_dwarf_f90;
  iVar1 = mp_check(&p_13,anon_var_dwarf_f90 + 4);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xd5\\x13\\x02\\x01\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x644,
      "invalid fixext16 - bad type");
  p_14 = anon_var_dwarf_fb4;
  iVar1 = mp_check(&p_14,anon_var_dwarf_fb4 + 4);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xd5\\x42\\x13\\x13\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x645,
      "invalid fixext16 - bad data");
  p_15 = anon_var_dwarf_fd8;
  iVar1 = mp_check(&p_15,anon_var_dwarf_fd8 + 4);
  _ok((uint)(iVar1 == 0),"mp_check(&p, p + sizeof(\"\\xd5\\x42\\x02\\x01\") - 1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x646,
      "valid fixext16");
  p_16 = anon_var_dwarf_ffc;
  iVar1 = mp_check(&p_16,anon_var_dwarf_ffc + 6);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xd6\\x13\\x04\\x03\\x02\\x01\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x649,
      "invalid fixext32 - bad type");
  p_17 = anon_var_dwarf_1020;
  iVar1 = mp_check(&p_17,anon_var_dwarf_1020 + 6);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xd6\\x42\\x13\\x13\\x13\\x13\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x64a,
      "invalid fixext32 - bad data");
  p_18 = anon_var_dwarf_1044;
  iVar1 = mp_check(&p_18,anon_var_dwarf_1044 + 6);
  _ok((uint)(iVar1 == 0),"mp_check(&p, p + sizeof(\"\\xd6\\x42\\x04\\x03\\x02\\x01\") - 1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x64b,
      "valid fixext32");
  p_19 = anon_var_dwarf_1068;
  iVar1 = mp_check(&p_19,anon_var_dwarf_1068 + 10);
  _ok((uint)(iVar1 != 0),
      "mp_check(&p, p + sizeof(\"\\xd7\\x13\\x08\\x07\\x06\\x05\\x04\\x03\\x02\\x01\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x64f,
      "invalid fixext64 - bad type");
  p_20 = anon_var_dwarf_1098;
  iVar1 = mp_check(&p_20,anon_var_dwarf_1098 + 10);
  _ok((uint)(iVar1 != 0),
      "mp_check(&p, p + sizeof(\"\\xd7\\x42\\x13\\x13\\x13\\x13\\x13\\x13\\x13\\x13\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x651,
      "invalid fixext64 - bad data");
  p_21 = anon_var_dwarf_10bc;
  iVar1 = mp_check(&p_21,anon_var_dwarf_10bc + 10);
  _ok((uint)(iVar1 == 0),
      "mp_check(&p, p + sizeof(\"\\xd7\\x42\\x08\\x07\\x06\\x05\\x04\\x03\\x02\\x01\") - 1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x653,
      "valid fixext64");
  p_22 = anon_var_dwarf_10e0;
  iVar1 = mp_check(&p_22,anon_var_dwarf_10e0 + 0x12);
  _ok((uint)(iVar1 != 0),
      "mp_check(&p, p + sizeof(\"\\xd8\\x13\\x10\\x0f\\x0e\\x0d\\x0c\\x0b\\x0a\\x09\\x08\\x07\\x06\\x05\\x04\" \"\\x03\\x02\\x01\") - 1) != 0"
      ,"/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x657
      ,"invalid fixext128 - bad type");
  p_23 = anon_var_dwarf_111c;
  iVar1 = mp_check(&p_23,anon_var_dwarf_111c + 0x12);
  _ok((uint)(iVar1 != 0),
      "mp_check(&p, p + sizeof(\"\\xd8\\x42\\x13\\x13\\x13\\x13\\x13\\x13\\x13\\x13\\x13\\x13\\x13\\x13\\x13\" \"\\x13\\x13\\x13\") - 1) != 0"
      ,"/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x659
      ,"invalid fixext128 - bad data");
  local_d0 = anon_var_dwarf_1140;
  iVar1 = mp_check(&local_d0,anon_var_dwarf_1140 + 0x12);
  _ok((uint)(iVar1 == 0),
      "mp_check(&p, p + sizeof(\"\\xd8\\x42\\x10\\x0f\\x0e\\x0d\\x0c\\x0b\\x0a\\x09\\x08\\x07\\x06\\x05\\x04\" \"\\x03\\x02\\x01\") - 1) == 0"
      ,"/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x65b
      ,"valid fixext128");
  mp_check_ext_data = (mp_check_ext_data_f)p;
  _space(_stdout);
  printf("# *** %s: done ***\n","test_mp_check_ext_data");
  iVar1 = check_plan();
  return iVar1;
}

Assistant:

int
test_mp_check_ext_data()
{
	plan(24);
	header();

#define invalid(data, fmt, ...) ({ \
	const char *p = data; \
	isnt(mp_check(&p, p + sizeof(data) - 1), 0, fmt, ## __VA_ARGS__); \
})
#define valid(data, fmt, ...) ({ \
	const char *p = data; \
	is(mp_check(&p, p + sizeof(data) - 1), 0, fmt, ## __VA_ARGS__); \
})

	mp_check_ext_data_f mp_check_ext_data_svp = mp_check_ext_data;
	mp_check_ext_data = mp_check_ext_data_test;

	/* ext8 */
	invalid("\xc7\x00\x13", "invalid ext8 - bad type");
	invalid("\xc7\x01\x42\x13", "invalid ext8 - bad data");
	valid("\xc7\x01\x42\x01", "valid ext8");

	/* ext16 */
	invalid("\xc8\x00\x00\x13", "invalid ext16 - bad type");
	invalid("\xc8\x00\x01\x42\x13", "invalid ext16 - bad data");
	valid("\xc8\x00\x01\x42\x01", "valid ext16");

	/* ext32 */
	invalid("\xc9\x00\x00\x00\x00\x13", "invalid ext32 - bad type");
	invalid("\xc9\x00\x00\x00\x01\x42\x13", "invalid ext32 - bad data");
	valid("\xc9\x00\x00\x00\x01\x42\x01", "valid ext32");

	/* fixext8 */
	invalid("\xd4\x13\x01", "invalid fixext8 - bad type");
	invalid("\xd4\x42\x13", "invalid fixext8 - bad data");
	valid("\xd4\x42\x01", "valid fixext8");

	/* fixext16 */
	invalid("\xd5\x13\x02\x01", "invalid fixext16 - bad type");
	invalid("\xd5\x42\x13\x13", "invalid fixext16 - bad data");
	valid("\xd5\x42\x02\x01", "valid fixext16");

	/* fixext32 */
	invalid("\xd6\x13\x04\x03\x02\x01", "invalid fixext32 - bad type");
	invalid("\xd6\x42\x13\x13\x13\x13", "invalid fixext32 - bad data");
	valid("\xd6\x42\x04\x03\x02\x01", "valid fixext32");

	/* fixext64 */
	invalid("\xd7\x13\x08\x07\x06\x05\x04\x03\x02\x01",
		"invalid fixext64 - bad type");
	invalid("\xd7\x42\x13\x13\x13\x13\x13\x13\x13\x13",
		"invalid fixext64 - bad data");
	valid("\xd7\x42\x08\x07\x06\x05\x04\x03\x02\x01",
	      "valid fixext64");

	/* fixext128 */
	invalid("\xd8\x13\x10\x0f\x0e\x0d\x0c\x0b\x0a\x09\x08\x07\x06\x05\x04"
		"\x03\x02\x01", "invalid fixext128 - bad type");
	invalid("\xd8\x42\x13\x13\x13\x13\x13\x13\x13\x13\x13\x13\x13\x13\x13"
		"\x13\x13\x13", "invalid fixext128 - bad data");
	valid("\xd8\x42\x10\x0f\x0e\x0d\x0c\x0b\x0a\x09\x08\x07\x06\x05\x04"
	      "\x03\x02\x01", "valid fixext128");

	mp_check_ext_data = mp_check_ext_data_svp;

#undef valid
#undef invalid

	footer();
	return check_plan();
}